

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_flux_mx(TrackData *trackdata,DataRate last_datarate)

{
  DataRate datarate_00;
  initializer_list<DataRate> __l;
  bool bVar1;
  int bitcell_ns;
  reference pDVar2;
  FluxData *flux_revs;
  Track *this;
  undefined1 local_160 [8];
  BitBuffer bitbuf;
  FluxDecoder decoder;
  iterator iStack_b0;
  DataRate datarate;
  iterator __end1;
  iterator __begin1;
  vector<DataRate,_std::allocator<DataRate>_> *__range1;
  undefined1 local_90 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
  local_80;
  reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
  local_78;
  __normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_> local_70;
  const_iterator local_68;
  allocator<DataRate> local_4d;
  DataRate local_4c [3];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<DataRate,_std::allocator<DataRate>_> datarates;
  DataRate last_datarate_local;
  TrackData *trackdata_local;
  
  local_4c[1] = 250000;
  local_4c[2] = 300000;
  local_40 = local_4c;
  local_38 = 3;
  local_4c[0] = last_datarate;
  datarates.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = last_datarate;
  std::allocator<DataRate>::allocator(&local_4d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<DataRate,_std::allocator<DataRate>_>::vector
            ((vector<DataRate,_std::allocator<DataRate>_> *)local_30,__l,&local_4d);
  std::allocator<DataRate>::~allocator(&local_4d);
  std::vector<DataRate,_std::allocator<DataRate>_>::rbegin
            ((vector<DataRate,_std::allocator<DataRate>_> *)(local_90 + 8));
  std::vector<DataRate,_std::allocator<DataRate>_>::rend
            ((vector<DataRate,_std::allocator<DataRate>_> *)local_90);
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<DataRate*,std::vector<DataRate,std::allocator<DataRate>>>>,DataRate>
            (&local_80,
             (reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
              *)(local_90 + 8),(DataRate *)local_90);
  std::
  next<std::reverse_iterator<__gnu_cxx::__normal_iterator<DataRate*,std::vector<DataRate,std::allocator<DataRate>>>>>
            (&local_78,(difference_type)&local_80);
  local_70._M_current =
       (DataRate *)
       std::
       reverse_iterator<__gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>_>
       ::base(&local_78);
  __gnu_cxx::__normal_iterator<DataRate_const*,std::vector<DataRate,std::allocator<DataRate>>>::
  __normal_iterator<DataRate*>
            ((__normal_iterator<DataRate_const*,std::vector<DataRate,std::allocator<DataRate>>> *)
             &local_68,&local_70);
  std::vector<DataRate,_std::allocator<DataRate>_>::erase
            ((vector<DataRate,_std::allocator<DataRate>_> *)local_30,local_68);
  __end1 = std::vector<DataRate,_std::allocator<DataRate>_>::begin
                     ((vector<DataRate,_std::allocator<DataRate>_> *)local_30);
  iStack_b0 = std::vector<DataRate,_std::allocator<DataRate>_>::end
                        ((vector<DataRate,_std::allocator<DataRate>_> *)local_30);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff50), bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>::
             operator*(&__end1);
    datarate_00 = *pDVar2;
    flux_revs = TrackData::flux(trackdata);
    bitcell_ns = ::bitcell_ns(datarate_00);
    FluxDecoder::FluxDecoder((FluxDecoder *)&bitbuf.m_wrapped,flux_revs,bitcell_ns,opt.scale,4);
    BitBuffer::BitBuffer((BitBuffer *)local_160,datarate_00,(FluxDecoder *)&bitbuf.m_wrapped);
    TrackData::add(trackdata,(BitBuffer *)local_160);
    scan_bitstream_mx(trackdata);
    this = TrackData::track(trackdata);
    bVar1 = Track::empty(this);
    BitBuffer::~BitBuffer((BitBuffer *)local_160);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<DataRate_*,_std::vector<DataRate,_std::allocator<DataRate>_>_>::
    operator++(&__end1);
  }
  std::vector<DataRate,_std::allocator<DataRate>_>::~vector
            ((vector<DataRate,_std::allocator<DataRate>_> *)local_30);
  return;
}

Assistant:

void scan_flux_mx(TrackData& trackdata, DataRate last_datarate)
{
    std::vector<DataRate> datarates = { last_datarate, DataRate::_250K, DataRate::_300K };
    datarates.erase(std::next(std::find(datarates.rbegin(), datarates.rend(), last_datarate)).base());

    for (auto datarate : datarates)
    {
        FluxDecoder decoder(trackdata.flux(), ::bitcell_ns(datarate), opt.scale);
        BitBuffer bitbuf(datarate, decoder);

        trackdata.add(std::move(bitbuf));
        scan_bitstream_mx(trackdata);

        // If we found something there's no need to check other data rates
        if (!trackdata.track().empty())
            break;
    }
}